

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

SizeType __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GetStringLength(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *this)

{
  ushort uVar1;
  
  uVar1 = (this->data_).f.flags;
  if ((uVar1 >> 10 & 1) == 0) {
    __assert_fail("IsString()",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                  ,0x742,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::GetStringLength() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((uVar1 >> 0xc & 1) == 0) {
    return (this->data_).s.length;
  }
  return 0xd - (int)(this->data_).ss.str[0xd];
}

Assistant:

bool IsString() const { return (data_.f.flags & kStringFlag) != 0; }